

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void performace_test(void)

{
  uint32_t uVar1;
  FastQueue *this;
  uint32_t *puVar2;
  uint32_t uVar3;
  ulong uVar4;
  pthread_t *__newthread;
  pthread_t *__newthread_00;
  pthread_t consumer [32];
  pthread_t producer [32];
  pthread_t local_228 [32];
  pthread_t local_128 [32];
  
  __newthread_00 = local_228;
  this = (FastQueue *)operator_new(0xc0);
  FastQueue::FastQueue(this,0x10,0x10);
  fastqueue = this;
  start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  uVar1 = 0;
  if (producer_num != 0) {
    puVar2 = p;
    __newthread = local_128;
    uVar4 = 0;
    do {
      pthread_create(__newthread,(pthread_attr_t *)0x0,producer_fun,puVar2);
      uVar4 = uVar4 + 1;
      puVar2 = puVar2 + 1;
      __newthread = __newthread + 1;
      uVar1 = producer_num;
    } while (uVar4 < producer_num);
  }
  uVar3 = 0;
  if (consumer_num != 0) {
    puVar2 = c;
    uVar4 = 0;
    do {
      pthread_create(__newthread_00,(pthread_attr_t *)0x0,consumer_fun,puVar2);
      uVar4 = uVar4 + 1;
      puVar2 = puVar2 + 1;
      __newthread_00 = __newthread_00 + 1;
      uVar1 = producer_num;
      uVar3 = consumer_num;
    } while (uVar4 < consumer_num);
  }
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      pthread_join(local_128[uVar4],(void **)0x0);
      uVar4 = uVar4 + 1;
      uVar3 = consumer_num;
    } while (uVar4 < producer_num);
  }
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      pthread_join(local_228[uVar4],(void **)0x0);
      uVar4 = uVar4 + 1;
    } while (uVar4 < consumer_num);
  }
  return;
}

Assistant:

void performace_test(){
     uint32_t  bucket_num = 16, pages_per_bucket = 10;
    pthread_t producer[32], consumer[32];
    
    
    fastqueue = new FastQueue(bucket_num, bucket_num);
    
    start = std::chrono::steady_clock::now();


    for(int i = 0; i < producer_num; ++i){
        pthread_create(&producer[i], NULL, producer_fun, &p[i]);
    }

    for(int i = 0; i < consumer_num; ++i){
        pthread_create(&consumer[i], NULL, consumer_fun, &c[i]);
    }

    for(int i = 0; i < producer_num; ++i){
        pthread_join(producer[i], NULL);
    }

    for(int i = 0; i < consumer_num; ++i){
        pthread_join(consumer[i], NULL);
    }


}